

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  double dVar1;
  uint32_t uVar2;
  TokenType TVar3;
  uint64_t uVar4;
  ushort *puVar5;
  LogMessageData *__n;
  undefined1 *puVar6;
  long lVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  int32_t iVar11;
  uint32_t uVar12;
  int iVar13;
  uint64_t uVar14;
  EnumDescriptor *this_00;
  EnumValueDescriptor *value_00;
  int64_t iVar15;
  Nonnull<char_*> pcVar16;
  EnumValueDescriptor *pEVar17;
  EnumValueDescriptor *pEVar18;
  Nonnull<const_char_*> pcVar19;
  Nonnull<const_char_*> extraout_RAX;
  Nonnull<const_char_*> extraout_RAX_00;
  byte bVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  undefined8 uVar22;
  AlphaNum *pAVar23;
  _Alloc_hider _Var24;
  bool bVar25;
  float fVar26;
  float fVar27;
  string_view name;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_01;
  int64_t value;
  int64_t int_value;
  string value_8;
  string value_4;
  string value_9;
  undefined1 local_140 [32];
  UnsetFieldsMetadata *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [32];
  string local_e8;
  string local_c8;
  undefined8 local_a8;
  char *local_a0;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_98;
  AlphaNum *local_90;
  undefined8 local_88;
  char *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar9 = ConsumeSignedInteger(this,(int64_t *)local_140,0x7fffffff);
    if (bVar9) {
      bVar20 = field->field_0x1;
      bVar10 = (bool)((bVar20 & 0x20) >> 5);
      if (0xbf < bVar20 == bVar10) {
        pcVar19 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar10,0xbf < bVar20,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar19 != (Nonnull<const_char_*>)0x0) {
LAB_00ffc6c2:
        ConsumeFieldValue();
LAB_00ffc6d2:
        ConsumeFieldValue();
LAB_00ffc6e2:
        ConsumeFieldValue();
LAB_00ffc6f2:
        ConsumeFieldValue();
        pcVar19 = extraout_RAX;
LAB_00ffc702:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar19);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_118);
      }
      if ((field->field_0x1 & 0x20) == 0) {
        if ((((this->no_op_fields_ == (UnsetFieldsMetadata *)0x0) ||
             (bVar10 = FieldDescriptor::has_presence(field), bVar10)) ||
            (iVar13 = (field->field_20).default_value_int32_t_,
            iVar11 = Reflection::GetInt32(reflection,message,field), iVar13 != iVar11)) ||
           ((field->field_20).default_value_int32_t_ != local_140._0_4_)) {
          Reflection::SetInt32(reflection,message,field,local_140._0_4_);
        }
        else {
LAB_00ffb97d:
          local_e8._M_dataplus._M_p = (pointer)this->no_op_fields_;
          local_118._0_8_ = message;
          local_118._8_8_ = field;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                      *)&local_c8,&local_e8,
                     (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                      *)local_118,
                     (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                      *)local_118);
        }
      }
      else {
        Reflection::AddInt32(reflection,message,field,local_140._0_4_);
      }
      goto LAB_00ffc3c3;
    }
    break;
  case 2:
    bVar9 = ConsumeSignedInteger(this,(int64_t *)local_140,0x7fffffffffffffff);
    if (bVar9) {
      bVar20 = field->field_0x1;
      bVar10 = (bool)((bVar20 & 0x20) >> 5);
      if (0xbf < bVar20 == bVar10) {
        pcVar19 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar10,0xbf < bVar20,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar19 != (Nonnull<const_char_*>)0x0) goto LAB_00ffc6e2;
      if ((field->field_0x1 & 0x20) == 0) {
        if (((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
            (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
           ((lVar7 = (field->field_20).default_value_int64_t_,
            iVar15 = Reflection::GetInt64(reflection,message,field), lVar7 == iVar15 &&
            ((AlphaNum *)(field->field_20).default_value_int64_t_ == (AlphaNum *)local_140._0_8_))))
        goto LAB_00ffb97d;
        Reflection::SetInt64(reflection,message,field,local_140._0_8_);
      }
      else {
        Reflection::AddInt64(reflection,message,field,local_140._0_8_);
      }
      goto LAB_00ffc3c3;
    }
    break;
  case 3:
    bVar9 = ConsumeUnsignedInteger(this,(uint64_t *)local_140,0xffffffff);
    if (bVar9) {
      bVar20 = field->field_0x1;
      bVar10 = (bool)((bVar20 & 0x20) >> 5);
      if (0xbf < bVar20 == bVar10) {
        pcVar19 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar10,0xbf < bVar20,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar19 != (Nonnull<const_char_*>)0x0) {
LAB_00ffc6b2:
        ConsumeFieldValue();
        goto LAB_00ffc6c2;
      }
      if ((field->field_0x1 & 0x20) == 0) {
        if (((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
            (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
           ((uVar2 = (field->field_20).default_value_int32_t_,
            uVar12 = Reflection::GetUInt32(reflection,message,field), uVar2 == uVar12 &&
            ((field->field_20).default_value_int32_t_ == local_140._0_4_)))) goto LAB_00ffb97d;
        Reflection::SetUInt32(reflection,message,field,local_140._0_4_);
      }
      else {
        Reflection::AddUInt32(reflection,message,field,local_140._0_4_);
      }
      goto LAB_00ffc3c3;
    }
    break;
  case 4:
    bVar9 = ConsumeUnsignedInteger(this,(uint64_t *)local_140,0xffffffffffffffff);
    if (bVar9) {
      bVar20 = field->field_0x1;
      bVar10 = (bool)((bVar20 & 0x20) >> 5);
      if (0xbf < bVar20 == bVar10) {
        pcVar19 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar10,0xbf < bVar20,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar19 != (Nonnull<const_char_*>)0x0) goto LAB_00ffc6d2;
      if ((field->field_0x1 & 0x20) == 0) {
        if ((((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
             (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
            (uVar4 = (field->field_20).default_value_int64_t_,
            uVar14 = Reflection::GetUInt64(reflection,message,field), uVar4 == uVar14)) &&
           ((AlphaNum *)(field->field_20).default_value_int64_t_ == (AlphaNum *)local_140._0_8_))
        goto LAB_00ffb97d;
        Reflection::SetUInt64(reflection,message,field,local_140._0_8_);
      }
      else {
        Reflection::AddUInt64(reflection,message,field,local_140._0_8_);
      }
      goto LAB_00ffc3c3;
    }
    break;
  case 5:
    bVar9 = ConsumeDouble(this,(double *)local_140);
    if (bVar9) {
      bVar20 = field->field_0x1;
      bVar10 = (bool)((bVar20 & 0x20) >> 5);
      if (0xbf < bVar20 == bVar10) {
        pcVar19 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar10,0xbf < bVar20,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar19 != (Nonnull<const_char_*>)0x0) {
        ConsumeFieldValue();
        goto LAB_00ffc6b2;
      }
      if ((field->field_0x1 & 0x20) == 0) {
        if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
           (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) {
          dVar1 = (field->field_20).default_value_double_;
          dVar8 = Reflection::GetDouble(reflection,message,field);
          if ((dVar1 == dVar8) && (!NAN(dVar1) && !NAN(dVar8))) {
            if (((field->field_20).default_value_double_ == (double)local_140._0_8_) &&
               (!NAN((field->field_20).default_value_double_) && !NAN((double)local_140._0_8_)))
            goto LAB_00ffb97d;
          }
        }
        Reflection::SetDouble(reflection,message,field,(double)local_140._0_8_);
      }
      else {
        Reflection::AddDouble(reflection,message,field,(double)local_140._0_8_);
      }
      goto LAB_00ffc3c3;
    }
    break;
  case 6:
    bVar9 = ConsumeDouble(this,(double *)local_140);
    if (bVar9) {
      bVar20 = field->field_0x1;
      bVar10 = (bool)((bVar20 & 0x20) >> 5);
      if (0xbf < bVar20 == bVar10) {
        pcVar19 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar10,0xbf < bVar20,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar19 != (Nonnull<const_char_*>)0x0) goto LAB_00ffc6f2;
      if ((field->field_0x1 & 0x20) == 0) {
        if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
           (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) {
          fVar27 = (field->field_20).default_value_float_;
          fVar26 = Reflection::GetFloat(reflection,message,field);
          if ((fVar27 == fVar26) && (!NAN(fVar27) && !NAN(fVar26))) {
            fVar27 = (field->field_20).default_value_float_;
            fVar26 = io::SafeDoubleToFloat((double)local_140._0_8_);
            if ((fVar27 == fVar26) && (!NAN(fVar27) && !NAN(fVar26))) goto LAB_00ffb97d;
          }
        }
        fVar27 = io::SafeDoubleToFloat((double)local_140._0_8_);
        Reflection::SetFloat(reflection,message,field,fVar27);
      }
      else {
        fVar27 = io::SafeDoubleToFloat((double)local_140._0_8_);
        Reflection::AddFloat(reflection,message,field,fVar27);
      }
      goto LAB_00ffc3c3;
    }
    break;
  case 7:
    if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
      bVar9 = ConsumeUnsignedInteger(this,(uint64_t *)local_140,1);
      if (bVar9) {
        bVar20 = field->field_0x1;
        bVar10 = (bool)((bVar20 & 0x20) >> 5);
        if (0xbf < bVar20 == bVar10) {
          pcVar19 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar10,0xbf < bVar20,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar19 != (Nonnull<const_char_*>)0x0) {
          ConsumeFieldValue();
          pcVar19 = extraout_RAX_00;
LAB_00ffc756:
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar19);
          goto LAB_00ffc8a3;
        }
        if ((field->field_0x1 & 0x20) == 0) {
          if (((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
              (bVar10 = FieldDescriptor::has_presence(field), !bVar10)) &&
             ((bVar10 = (field->field_20).default_value_bool_,
              bVar25 = Reflection::GetBool(reflection,message,field), bVar25 == bVar10 &&
              (((AlphaNum *)local_140._0_8_ == (AlphaNum *)0x0) !=
               (field->field_20).default_value_bool_)))) goto LAB_00ffb97d;
          Reflection::SetBool(reflection,message,field,
                              (AlphaNum *)local_140._0_8_ != (AlphaNum *)0x0);
        }
        else {
          Reflection::AddBool(reflection,message,field,
                              (AlphaNum *)local_140._0_8_ != (AlphaNum *)0x0);
        }
        goto LAB_00ffc3c3;
      }
    }
    else {
      local_118._8_8_ =
           (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            )0x0;
      local_108[0] = '\0';
      local_118._0_8_ = (AlphaNum *)local_108;
      bVar9 = ConsumeIdentifier(this,(string *)local_118);
      if (bVar9) {
        iVar13 = std::__cxx11::string::compare(local_118);
        if (((iVar13 == 0) || (iVar13 = std::__cxx11::string::compare(local_118), iVar13 == 0)) ||
           (iVar13 = std::__cxx11::string::compare(local_118), iVar13 == 0)) {
          bVar20 = field->field_0x1;
          bVar9 = (bool)((bVar20 & 0x20) >> 5);
          if (0xbf < bVar20 == bVar9) {
            pcVar19 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar9,0xbf < bVar20,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar19 != (Nonnull<const_char_*>)0x0) goto LAB_00ffc756;
          bVar9 = true;
          if ((field->field_0x1 & 0x20) != 0) goto LAB_00ffc3da;
          if (((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
              (bVar9 = FieldDescriptor::has_presence(field), !bVar9)) &&
             ((bVar9 = (field->field_20).default_value_bool_,
              bVar10 = Reflection::GetBool(reflection,message,field), bVar10 == bVar9 &&
              ((field->field_20).default_value_bool_ == true)))) {
            local_140._0_8_ = this->no_op_fields_;
            local_e8._M_dataplus._M_p = (pointer)message;
            local_e8._M_string_length = (size_type)field;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
            ::EmplaceDecomposable::operator()
                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                        *)&local_c8,local_140,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_e8,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_e8);
            goto LAB_00ffbe65;
          }
          bVar10 = true;
          Reflection::SetBool(reflection,message,field,true);
        }
        else {
          iVar13 = std::__cxx11::string::compare(local_118);
          if (((iVar13 != 0) && (iVar13 = std::__cxx11::string::compare(local_118), iVar13 != 0)) &&
             (iVar13 = std::__cxx11::string::compare(local_118), iVar13 != 0)) {
            puVar5 = (ushort *)(field->all_names_).payload_;
            local_c8.field_2._M_allocated_capacity = (size_type)*puVar5;
            local_c8._M_dataplus._M_p = &DAT_00000021;
            local_c8._M_string_length = 0x144214f;
            local_c8.field_2._8_8_ = (long)puVar5 + ~local_c8.field_2._M_allocated_capacity;
            local_a8 = 0xb;
            local_a0 = "\". Value: \"";
            local_98._M_head_impl = (LogMessageData *)local_118._8_8_;
            local_90 = (AlphaNum *)local_118._0_8_;
            local_88 = 2;
            local_80 = "\".";
            pieces._M_len = (size_type)"\". Value: \"";
            pieces._M_array = (iterator)&DAT_00000005;
            absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                      (&local_e8,(strings_internal *)&local_c8,pieces);
            message_00._M_str = local_e8._M_dataplus._M_p;
            message_00._M_len = local_e8._M_string_length;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,
                              CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                       local_e8.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_00ffbbf1;
          }
          bVar9 = FieldDescriptor::is_repeated(field);
          if (bVar9) {
            bVar9 = false;
LAB_00ffc3da:
            bVar10 = true;
            Reflection::AddBool(reflection,message,field,bVar9);
          }
          else if ((((this->no_op_fields_ == (UnsetFieldsMetadata *)0x0) ||
                    (bVar9 = FieldDescriptor::has_presence(field), bVar9)) ||
                   (bVar9 = (field->field_20).default_value_bool_,
                   bVar10 = Reflection::GetBool(reflection,message,field), bVar10 != bVar9)) ||
                  ((field->field_20).default_value_bool_ != false)) {
            bVar10 = true;
            Reflection::SetBool(reflection,message,field,false);
          }
          else {
            local_140._0_8_ = this->no_op_fields_;
            local_e8._M_dataplus._M_p = (pointer)message;
            local_e8._M_string_length = (size_type)field;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
            ::EmplaceDecomposable::operator()
                      ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                        *)&local_c8,local_140,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_e8,
                       (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                        *)&local_e8);
LAB_00ffbe65:
            bVar10 = true;
          }
        }
      }
      else {
LAB_00ffbbf1:
        bVar10 = false;
      }
      if ((AlphaNum *)local_118._0_8_ != (AlphaNum *)local_108) {
        operator_delete((void *)local_118._0_8_,CONCAT71(local_108._1_7_,local_108[0]) + 1);
      }
      if (bVar10) goto switchD_00ffb496_default;
    }
    break;
  case 8:
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_120 = (UnsetFieldsMetadata *)0x7fffffffffffffff;
    this_00 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar9 = ConsumeIdentifier(this,&local_e8);
      if (!bVar9) goto LAB_00ffc313;
      name._M_str = local_e8._M_dataplus._M_p;
      name._M_len = local_e8._M_string_length;
      value_00 = EnumDescriptor::FindValueByName(this_00,name);
LAB_00ffbf19:
      if (value_00 == (EnumValueDescriptor *)0x0) {
        if ((local_120 == (UnsetFieldsMetadata *)0x7fffffffffffffff) ||
           (bVar9 = FieldDescriptor::legacy_enum_field_treated_as_closed(field), bVar9)) {
          if (this->allow_unknown_enum_ == false) {
            puVar5 = (ushort *)(field->all_names_).payload_;
            local_98._M_head_impl = (LogMessageData *)(ulong)*puVar5;
            local_c8._M_dataplus._M_p = &DAT_0000001e;
            local_c8._M_string_length = 0x14421a3;
            local_c8.field_2._M_allocated_capacity = local_e8._M_string_length;
            local_c8.field_2._8_8_ = local_e8._M_dataplus._M_p;
            local_a8 = 0xd;
            local_a0 = "\" for field \"";
            local_90 = (AlphaNum *)((long)puVar5 + ~(ulong)local_98._M_head_impl);
            local_88 = 2;
            local_80 = "\".";
            pieces_01._M_len = local_e8._M_string_length;
            pieces_01._M_array = (iterator)&DAT_00000005;
            absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                      ((string *)local_118,(strings_internal *)&local_c8,pieces_01);
            message_03._M_str = (char *)local_118._0_8_;
            message_03._M_len = local_118._8_8_;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_03);
            if ((AlphaNum *)local_118._0_8_ != (AlphaNum *)local_108) {
              local_140._16_8_ = CONCAT71(local_108._1_7_,local_108[0]);
              pAVar23 = (AlphaNum *)local_118._0_8_;
              goto LAB_00ffc30b;
            }
            goto LAB_00ffc313;
          }
          puVar5 = (ushort *)(field->all_names_).payload_;
          local_98._M_head_impl = (LogMessageData *)(ulong)*puVar5;
          local_c8._M_dataplus._M_p = &DAT_0000001e;
          local_c8._M_string_length = 0x14421a3;
          local_c8.field_2._M_allocated_capacity = local_e8._M_string_length;
          local_c8.field_2._8_8_ = local_e8._M_dataplus._M_p;
          local_a8 = 0xd;
          local_a0 = "\" for field \"";
          local_90 = (AlphaNum *)((long)puVar5 + ~(ulong)local_98._M_head_impl);
          local_88 = 2;
          local_80 = "\".";
          pieces_00._M_len = local_e8._M_string_length;
          pieces_00._M_array = (iterator)&DAT_00000005;
          absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                    ((string *)local_118,(strings_internal *)&local_c8,pieces_00);
          message_02._M_str = (char *)local_118._0_8_;
          message_02._M_len = local_118._8_8_;
          ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_02);
          if ((AlphaNum *)local_118._0_8_ != (AlphaNum *)local_108) {
            operator_delete((void *)local_118._0_8_,CONCAT71(local_108._1_7_,local_108[0]) + 1);
          }
LAB_00ffc087:
          bVar9 = true;
          field = (FieldDescriptor *)0x1;
        }
        else {
          bVar9 = FieldDescriptor::is_repeated(field);
          if (bVar9) {
            bVar9 = true;
            Reflection::AddEnumValue(reflection,message,field,(int)local_120);
            field = (FieldDescriptor *)0x1;
          }
          else {
            if ((((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
                 (bVar9 = FieldDescriptor::has_presence(field), !bVar9)) &&
                (lVar7 = (field->field_20).default_value_int64_t_,
                iVar13 = Reflection::GetEnumValue(reflection,message,field), lVar7 == iVar13)) &&
               ((UnsetFieldsMetadata *)(field->field_20).default_value_int64_t_ == local_120)) {
              local_140._0_8_ = this->no_op_fields_;
              local_118._0_8_ = message;
              local_118._8_8_ = field;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
              ::EmplaceDecomposable::operator()
                        ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                          *)&local_c8,local_140,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)local_118,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)local_118);
              goto LAB_00ffc087;
            }
            bVar9 = true;
            Reflection::SetEnumValue(reflection,message,field,(int)local_120);
            field = (FieldDescriptor *)0x1;
          }
        }
      }
      else {
        bVar20 = field->field_0x1;
        bVar9 = (bool)((bVar20 & 0x20) >> 5);
        if (0xbf < bVar20 == bVar9) {
          pcVar19 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar9,0xbf < bVar20,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar19 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar19);
LAB_00ffc8a3:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_c8);
        }
        if ((field->field_0x1 & 0x20) == 0) {
          if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
             (bVar9 = FieldDescriptor::has_presence(field), !bVar9)) {
            pEVar17 = FieldDescriptor::default_value_enum(field);
            pEVar18 = Reflection::GetEnum(reflection,message,field);
            if ((pEVar17 == pEVar18) &&
               (pEVar17 = FieldDescriptor::default_value_enum(field), pEVar17 == value_00)) {
              local_140._0_8_ = this->no_op_fields_;
              local_118._0_8_ = message;
              local_118._8_8_ = field;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
              ::EmplaceDecomposable::operator()
                        ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                          *)&local_c8,local_140,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)local_118,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)local_118);
              goto LAB_00ffc0a2;
            }
          }
          Reflection::SetEnum(reflection,message,field,value_00);
        }
        else {
          Reflection::AddEnum(reflection,message,field,value_00);
        }
LAB_00ffc0a2:
        bVar9 = false;
      }
    }
    else {
      paVar21 = &local_c8.field_2;
      local_c8._M_dataplus._M_p = (pointer)paVar21;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"-","");
      puVar6 = (undefined1 *)(this->tokenizer_).current_.text._M_string_length;
      if ((puVar6 == (undefined1 *)local_c8._M_string_length) &&
         ((puVar6 == (undefined1 *)0x0 ||
          (iVar13 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_c8._M_dataplus._M_p
                         ,(size_t)puVar6), iVar13 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar21) {
          operator_delete(local_c8._M_dataplus._M_p,
                          (ulong)(local_c8.field_2._M_allocated_capacity + 1));
        }
LAB_00ffbe8a:
        paVar21 = &local_c8.field_2;
        bVar9 = ConsumeSignedInteger(this,(int64_t *)&local_120,0x7fffffff);
        if (bVar9) {
          pcVar16 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                              ((int64_t)local_120,paVar21->_M_local_buf);
          local_c8._M_dataplus._M_p = pcVar16 + -(long)paVar21;
          local_118._0_8_ = local_108;
          local_c8._M_string_length = (size_type)paVar21;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_118,paVar21,pcVar16);
          std::__cxx11::string::operator=((string *)&local_e8,(string *)local_118);
          if ((AlphaNum *)local_118._0_8_ != (AlphaNum *)local_108) {
            operator_delete((void *)local_118._0_8_,CONCAT71(local_108._1_7_,local_108[0]) + 1);
          }
          value_00 = EnumDescriptor::FindValueByNumber(this_00,(int)local_120);
          goto LAB_00ffbf19;
        }
      }
      else {
        TVar3 = (this->tokenizer_).current_.type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar21) {
          operator_delete(local_c8._M_dataplus._M_p,
                          (ulong)(local_c8.field_2._M_allocated_capacity + 1));
        }
        if (TVar3 == TYPE_INTEGER) goto LAB_00ffbe8a;
        local_c8._M_dataplus._M_p = (pointer)0x25;
        local_c8._M_string_length = 0x144217d;
        local_118._8_8_ = (this->tokenizer_).current_.text._M_dataplus._M_p;
        local_118._0_8_ = (this->tokenizer_).current_.text._M_string_length;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_140,(lts_20250127 *)&local_c8,(AlphaNum *)local_118,
                   (AlphaNum *)local_118._0_8_);
        message_01._M_str = (char *)local_140._0_8_;
        message_01._M_len = local_140._8_8_;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_01);
        pAVar23 = (AlphaNum *)local_140._0_8_;
        if ((AlphaNum *)local_140._0_8_ == (AlphaNum *)(local_140 + 0x10)) goto LAB_00ffc313;
LAB_00ffc30b:
        operator_delete(pAVar23,local_140._16_8_ + 1);
      }
LAB_00ffc313:
      bVar9 = true;
      field = (FieldDescriptor *)0x0;
    }
    bVar20 = (byte)field;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                               local_e8.field_2._M_local_buf[0]) + 1);
    }
    if (bVar9) goto LAB_00ffc40c;
  default:
switchD_00ffb496_default:
    bVar20 = 1;
    goto LAB_00ffc40c;
  case 9:
    paVar21 = &local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity =
         local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_c8._M_dataplus._M_p = (pointer)paVar21;
    bVar9 = ConsumeString(this,&local_c8);
    if (!bVar9) goto LAB_00ffc3a6;
    bVar20 = field->field_0x1;
    bVar10 = (bool)((bVar20 & 0x20) >> 5);
    if (0xbf < bVar20 == bVar10) {
      pcVar19 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar19 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar10,0xbf < bVar20,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar19 != (Nonnull<const_char_*>)0x0) goto LAB_00ffc702;
    if ((field->field_0x1 & 0x20) == 0) {
      if ((this->no_op_fields_ == (UnsetFieldsMetadata *)0x0) ||
         (bVar10 = FieldDescriptor::has_presence(field), bVar10)) {
        bVar10 = false;
LAB_00ffba29:
        bVar25 = false;
      }
      else {
        local_78 = (((field->field_20).default_value_string_)->_M_dataplus)._M_p;
        __n = (LogMessageData *)((field->field_20).default_value_string_)->_M_string_length;
        Reflection::GetString_abi_cxx11_((string *)local_118,reflection,message,field);
        bVar10 = true;
        if (__n != (LogMessageData *)local_118._8_8_) goto LAB_00ffba29;
        if (__n != (LogMessageData *)0x0) {
          iVar13 = bcmp(local_78,(void *)local_118._0_8_,(size_t)__n);
          bVar10 = true;
          if (iVar13 != 0) goto LAB_00ffba29;
        }
        bVar10 = true;
        puVar6 = (undefined1 *)((field->field_20).default_value_string_)->_M_string_length;
        if (puVar6 != (undefined1 *)local_c8._M_string_length) goto LAB_00ffba29;
        bVar10 = true;
        if (puVar6 == (undefined1 *)0x0) {
          bVar25 = true;
        }
        else {
          iVar13 = bcmp((((field->field_20).default_value_string_)->_M_dataplus)._M_p,
                        local_c8._M_dataplus._M_p,(size_t)puVar6);
          bVar10 = true;
          bVar25 = iVar13 == 0;
        }
      }
      if ((bVar10) && ((AlphaNum *)local_118._0_8_ != (AlphaNum *)local_108)) {
        operator_delete((void *)local_118._0_8_,CONCAT71(local_108._1_7_,local_108[0]) + 1);
      }
      if (bVar25) {
        local_120 = this->no_op_fields_;
        local_140._0_8_ = message;
        local_140._8_8_ = field;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                    *)&local_e8,&local_120,
                   (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                    *)local_140,
                   (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                    *)local_140);
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == paVar21) {
          local_70.field_2._8_8_ = local_c8.field_2._8_8_;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70._M_dataplus._M_p = local_c8._M_dataplus._M_p;
        }
        local_70.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
        local_70._M_string_length = local_c8._M_string_length;
        local_c8._M_string_length = 0;
        local_c8.field_2._M_allocated_capacity =
             local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_c8._M_dataplus._M_p = (pointer)paVar21;
        Reflection::SetString(reflection,message,field,&local_70);
        uVar22 = local_70.field_2._M_allocated_capacity;
        _Var24._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00ffc39e;
      }
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == paVar21) {
        local_50.field_2._8_8_ = local_c8.field_2._8_8_;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50._M_dataplus._M_p = local_c8._M_dataplus._M_p;
      }
      local_50.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
      local_50._M_string_length = local_c8._M_string_length;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_allocated_capacity =
           local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_c8._M_dataplus._M_p = (pointer)paVar21;
      Reflection::AddString(reflection,message,field,&local_50);
      uVar22 = local_50.field_2._M_allocated_capacity;
      _Var24._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00ffc3a6;
LAB_00ffc39e:
      operator_delete(_Var24._M_p,(ulong)&((FieldDescriptor *)uVar22)->field_0x1);
    }
LAB_00ffc3a6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar21) {
      operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1))
      ;
    }
LAB_00ffc3c3:
    if (bVar9 != false) goto switchD_00ffb496_default;
    break;
  case 10:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x3aa);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_c8,(char (*) [45])"Reached an unintended state: CPPTYPE_MESSAGE"
              );
    goto LAB_00ffc8a3;
  }
  bVar20 = 0;
LAB_00ffc40c:
  return (bool)(bVar20 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
// When checking for no-op operations, We verify that both the existing value in
// the message and the new value are the default. If the existing field value is
// not the default, setting it to the default should not be treated as a no-op.
// The pointer of this is kept in no_op_fields_ for bookkeeping.
#define SET_FIELD(CPPTYPE, CPPTYPELCASE, VALUE)                    \
  if (field->is_repeated()) {                                      \
    reflection->Add##CPPTYPE(message, field, VALUE);               \
  } else {                                                         \
    if (no_op_fields_ && !field->has_presence() &&                 \
        field->default_value_##CPPTYPELCASE() ==                   \
            reflection->Get##CPPTYPE(*message, field) &&           \
        field->default_value_##CPPTYPELCASE() == VALUE) {          \
      no_op_fields_->ids_.insert(                                  \
          UnsetFieldsMetadata::GetUnsetFieldId(*message, *field)); \
    } else {                                                       \
      reflection->Set##CPPTYPE(message, field, std::move(VALUE));  \
    }                                                              \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64_t value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, int32, static_cast<int32_t>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64_t value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, uint32, static_cast<uint32_t>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64_t value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64_t value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, uint64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, string, std::move(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64_t value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, bool, static_cast<bool>(value));
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, bool, false);
          } else {
            ReportError(absl::StrCat("Invalid value for boolean field \"",
                                     field->name(), "\". Value: \"", value,
                                     "\"."));
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64_t int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = absl::StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError(absl::StrCat("Expected integer or identifier, got: ",
                                   tokenizer_.current().text));
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              !field->legacy_enum_field_treated_as_closed()) {
            SET_FIELD(EnumValue, int64, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError(absl::StrCat("Unknown enumeration value of \"", value,
                                     "\" for field \"", field->name(), "\"."));
            return false;
          } else {
            ReportWarning(absl::StrCat("Unknown enumeration value of \"", value,
                                       "\" for field \"", field->name(),
                                       "\"."));
            return true;
          }
        }

        SET_FIELD(Enum, enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        ABSL_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }